

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_sync_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::subscription_sync_test::SubscriptionSyncTest_test_summarize_Test::
TestBody(SubscriptionSyncTest_test_summarize_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_168;
  Message local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_2;
  Message local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_e0;
  Message local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_90;
  SubscriptionSync local_78 [8];
  SubscriptionSync subscription_sync;
  SubscriptionSyncTest_test_summarize_Test *this_local;
  
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector(&local_90,
           (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            *)subject_list);
  bidfx_public_api::price::pixie::SubscriptionSync::SubscriptionSync(local_78,0x7b,&local_90);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_90);
  bidfx_public_api::price::pixie::SubscriptionSync::Summarize_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[86],std::__cxx11::string>
            ((EqHelper<false> *)local_b0,
             "\"SubscriptionSync(edition=123, compressed=false, controls=0, changed=true, subjects=2)\""
             ,"subscription_sync.Summarize()",
             (char (*) [86])
             "SubscriptionSync(edition=123, compressed=false, controls=0, changed=true, subjects=2)"
             ,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/subscription_sync_test.cpp"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    bidfx_public_api::price::pixie::SubscriptionSync::AddControl((uint)local_78,REFRESH);
    bidfx_public_api::price::pixie::SubscriptionSync::AddControl((uint)local_78,TOGGLE);
    bidfx_public_api::price::pixie::SubscriptionSync::Summarize_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<char[86],std::__cxx11::string>
              ((EqHelper<false> *)local_f8,
               "\"SubscriptionSync(edition=123, compressed=false, controls=2, changed=true, subjects=2)\""
               ,"subscription_sync.Summarize()",
               (char (*) [86])
               "SubscriptionSync(edition=123, compressed=false, controls=2, changed=true, subjects=2)"
               ,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/subscription_sync_test.cpp"
                 ,0x57,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_120);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      bidfx_public_api::price::pixie::SubscriptionSync::SetCompressed(SUB81(local_78,0));
      bidfx_public_api::price::pixie::SubscriptionSync::Summarize_abi_cxx11_();
      testing::internal::EqHelper<false>::Compare<char[85],std::__cxx11::string>
                ((EqHelper<false> *)local_138,
                 "\"SubscriptionSync(edition=123, compressed=true, controls=2, changed=true, subjects=2)\""
                 ,"subscription_sync.Summarize()",
                 (char (*) [85])
                 "SubscriptionSync(edition=123, compressed=true, controls=2, changed=true, subjects=2)"
                 ,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
      if (!bVar1) {
        testing::Message::Message(&local_160);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
        testing::internal::AssertHelper::AssertHelper
                  (&local_168,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/subscription_sync_test.cpp"
                   ,0x5b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_168,&local_160);
        testing::internal::AssertHelper::~AssertHelper(&local_168);
        testing::Message::~Message(&local_160);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        gtest_ar_1.message_.ptr_._4_4_ = 0;
      }
    }
  }
  SubscriptionSync::~SubscriptionSync(local_78);
  return;
}

Assistant:

TEST(SubscriptionSyncTest, test_summarize)
{
    SubscriptionSync subscription_sync = SubscriptionSync(EDITION, subject_list);
    ASSERT_EQ("SubscriptionSync(edition=123, compressed=false, controls=0, changed=true, subjects=2)",
                 subscription_sync.Summarize());

    subscription_sync.AddControl(0, ControlOperationEnum::TOGGLE);
    subscription_sync.AddControl(1, ControlOperationEnum::REFRESH);
    ASSERT_EQ("SubscriptionSync(edition=123, compressed=false, controls=2, changed=true, subjects=2)",
                 subscription_sync.Summarize());

    subscription_sync.SetCompressed(true);
    ASSERT_EQ("SubscriptionSync(edition=123, compressed=true, controls=2, changed=true, subjects=2)",
                 subscription_sync.Summarize());
}